

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O3

node_type * __thiscall
st_tree::detail::
node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>::
_copy_data(node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>
           *this,tree_type *tree_)

{
  new_allocator<st_tree::detail::node_raw<st_tree::tree<ut_raw::emplace_subnodes::test_method()::str1,st_tree::raw<st_tree::arg_unused>,std::allocator<ut_raw::emplace_subnodes::test_method()::str1>>,ut_raw::emplace_subnodes::test_method()::str1>>
  *this_00;
  node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>
  *__args;
  tree_type *tree__00;
  pointer ppnVar1;
  node_type *local_30;
  
  this_00 = (new_allocator<st_tree::detail::node_raw<st_tree::tree<ut_raw::emplace_subnodes::test_method()::str1,st_tree::raw<st_tree::arg_unused>,std::allocator<ut_raw::emplace_subnodes::test_method()::str1>>,ut_raw::emplace_subnodes::test_method()::str1>>
             *)operator_new(0x88);
  __gnu_cxx::
  new_allocator<st_tree::detail::node_raw<st_tree::tree<ut_raw::emplace_subnodes::test_method()::str1,st_tree::raw<st_tree::arg_unused>,std::allocator<ut_raw::emplace_subnodes::test_method()::str1>>,ut_raw::emplace_subnodes::test_method()::str1>>
  ::
  construct<st_tree::detail::node_raw<st_tree::tree<ut_raw::emplace_subnodes::test_method()::str1,st_tree::raw<st_tree::arg_unused>,std::allocator<ut_raw::emplace_subnodes::test_method()::str1>>,ut_raw::emplace_subnodes::test_method()::str1>,st_tree::detail::node_raw<st_tree::tree<ut_raw::emplace_subnodes::test_method()::str1,st_tree::raw<st_tree::arg_unused>,std::allocator<ut_raw::emplace_subnodes::test_method()::str1>>,ut_raw::emplace_subnodes::test_method()::str1>const&>
            (this_00,(node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>
                      *)tree_,__args);
  *(int *)(this_00 + 0x20) =
       (this->
       super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
       )._data.i1;
  tree__00 = (tree_type *)
             &(this->
              super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
              )._data.s1;
  std::__cxx11::string::_M_assign((string *)(this_00 + 0x28));
  if (this_00 !=
      (new_allocator<st_tree::detail::node_raw<st_tree::tree<ut_raw::emplace_subnodes::test_method()::str1,st_tree::raw<st_tree::arg_unused>,std::allocator<ut_raw::emplace_subnodes::test_method()::str1>>,ut_raw::emplace_subnodes::test_method()::str1>>
       *)this) {
    *(unsigned_long *)(this_00 + 0x80) =
         (this->
         super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
         )._depth._max;
    tree__00 = (tree_type *)
               &(this->
                super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
                )._depth._hist;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this_00 + 0x68),
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)tree__00);
  }
  ppnVar1 = (this->
            super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
            )._children.
            super__Vector_base<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppnVar1 !=
      (this->
      super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
      )._children.
      super__Vector_base<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_30 = _copy_data(*ppnVar1,tree__00);
      tree__00 = (tree_type *)&local_30;
      std::
      vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
      ::push_back((vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
                   *)(this_00 + 0x48),(value_type *)&local_30);
      ppnVar1 = ppnVar1 + 1;
    } while (ppnVar1 !=
             (this->
             super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
             )._children.
             super__Vector_base<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return (node_type *)this_00;
}

Assistant:

node_type* _copy_data(tree_type& tree_) const {
        node_type* n = tree_._new_node();
        n->_data = this->_data;
        n->_depth = this->_depth;
        for (cs_const_iterator j(this->_children.begin()); j != this->_children.end(); ++j)
            n->_children.push_back((*j)->_copy_data(tree_));
        return n;
    }